

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_server_test.cpp
# Opt level: O0

string * GetFile_abi_cxx11_(void)

{
  string *in_RDI;
  istreambuf_iterator<char,_std::char_traits<char>_> __beg;
  istreambuf_iterator<char,_std::char_traits<char>_> __end;
  allocator<char> local_259;
  undefined1 local_258 [12];
  undefined1 local_248 [12];
  string local_238 [8];
  string str;
  ifstream t;
  
  std::ifstream::ifstream((istream_type *)(str.field_2._M_local_buf + 8),"logo.png",8);
  std::istreambuf_iterator<char,_std::char_traits<char>_>::istreambuf_iterator
            ((istreambuf_iterator<char,_std::char_traits<char>_> *)local_248,
             (istream_type *)(str.field_2._M_local_buf + 8));
  std::istreambuf_iterator<char,_std::char_traits<char>_>::istreambuf_iterator
            ((istreambuf_iterator<char,_std::char_traits<char>_> *)local_258);
  std::allocator<char>::allocator();
  __beg._12_4_ = 0;
  __beg._M_sbuf = (streambuf_type *)local_248._0_8_;
  __beg._M_c = local_248._8_4_;
  __end._12_4_ = 0;
  __end._M_sbuf = (streambuf_type *)local_258._0_8_;
  __end._M_c = local_258._8_4_;
  std::__cxx11::string::string<std::istreambuf_iterator<char,std::char_traits<char>>,void>
            (local_238,__beg,__end,&local_259);
  std::allocator<char>::~allocator(&local_259);
  std::__cxx11::string::string((string *)in_RDI,local_238);
  std::__cxx11::string::~string(local_238);
  std::ifstream::~ifstream((void *)((long)&str.field_2 + 8));
  return in_RDI;
}

Assistant:

std::string GetFile() {
    std::ifstream t("logo.png");
    std::string str((std::istreambuf_iterator<char>(t)),
        std::istreambuf_iterator<char>());
    return std::move(str);
}